

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMdisk.cpp
# Opt level: O0

int main(int argc_,char **argv_)

{
  bool bVar1;
  int iVar2;
  logic_error *this;
  LogHelper *pLVar3;
  long lVar4;
  bool local_8ba;
  bool local_751;
  duration<long,_std::ratio<1L,_1000000000L>_> local_720;
  duration<long,_std::ratio<1L,_1000L>_> local_718;
  rep local_710;
  rep elapsed_ms;
  time_point end_time;
  string *e;
  exception *e_1;
  system_error *e_2;
  logic_error *e_3;
  exception *e_4;
  string local_688;
  Range local_668;
  allocator<char> local_649;
  string local_648;
  Range local_628;
  allocator<char> local_609;
  string local_608;
  Range local_5e8;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  Range local_558;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  byte local_4cb;
  byte local_4ca;
  allocator<char> local_4c9;
  string local_4c8;
  Range local_4a8;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  Range local_418;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  Range local_368;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  byte local_ab;
  byte local_aa;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  int local_60;
  allocator<char> local_59;
  int nTarget;
  int local_38;
  int nSource;
  byte local_21;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_20;
  bool f;
  time_point start_time;
  char **argv__local;
  int argc__local;
  
  start_time.__d.__r = (duration)(duration)argv_;
  tStack_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_21 = 0;
  bVar1 = ParseCommandLine(argc_,(char **)start_time.__d.__r);
  if (bVar1) {
    if (optind < argc_) {
      lVar4 = (long)optind;
      optind = optind + 1;
      strncpy(opt.szSource,*(char **)((long)start_time.__d.__r + lVar4 * 8),0x1ff);
    }
    if (optind < argc_) {
      lVar4 = (long)optind;
      optind = optind + 1;
      strncpy(opt.szTarget,*(char **)((long)start_time.__d.__r + lVar4 * 8),0x1ff);
    }
    if (optind < argc_) {
      Usage();
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&nTarget,opt.szSource,&local_59);
    iVar2 = GetArgType((string *)&nTarget);
    std::__cxx11::string::~string((string *)&nTarget);
    std::allocator<char>::~allocator(&local_59);
    local_38 = iVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,opt.szTarget,&local_81);
    iVar2 = GetArgType(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    local_60 = iVar2;
    switch(opt.command) {
    case 0:
      if ((local_38 == 0) || (iVar2 == 0)) {
        Usage();
      }
      local_aa = 0;
      local_ab = 0;
      local_751 = false;
      if (local_38 == 4) {
        std::allocator<char>::allocator();
        local_aa = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,opt.szTarget,&local_a9);
        local_ab = 1;
        local_751 = IsTrinity(&local_a8);
      }
      if ((local_ab & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a8);
      }
      if ((local_aa & 1) != 0) {
        std::allocator<char>::~allocator(&local_a9);
      }
      if (local_751 == false) {
        if (((local_38 == 1) || (local_38 == 4)) && ((local_60 == 4 || (local_60 == 2)))) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,opt.szSource,&local_121);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,opt.szTarget,&local_149);
          local_21 = ImageToImage(&local_120,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::allocator<char>::~allocator(&local_149);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
        }
        else if (((local_38 == 2) || (local_38 == 1)) && (local_60 == 2)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,opt.szSource,&local_171);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_198,opt.szTarget,&local_199);
          local_21 = Hdd2Hdd(&local_170,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator(&local_199);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator(&local_171);
        }
        else if ((local_38 == 3) && (local_60 == 4)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,opt.szSource,&local_1c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e8,opt.szTarget,&local_1e9);
          local_21 = Hdd2Boot(&local_1c0,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator(&local_1e9);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::allocator<char>::~allocator(&local_1c1);
        }
        else if ((local_38 == 4) && (local_60 == 3)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_210,opt.szSource,&local_211);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,opt.szTarget,&local_239);
          local_21 = Boot2Hdd(&local_210,&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          std::allocator<char>::~allocator(&local_239);
          std::__cxx11::string::~string((string *)&local_210);
          std::allocator<char>::~allocator(&local_211);
        }
        else if ((local_38 == 3) && (local_60 == 3)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_260,opt.szSource,&local_261);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,opt.szTarget,&local_289);
          local_21 = Boot2Boot(&local_260,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator(&local_289);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator(&local_261);
        }
        else {
          Usage();
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,opt.szSource,&local_d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,opt.szTarget,&local_f9);
        local_21 = Image2Trinity(&local_d0,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
      }
      break;
    case 1:
      if ((local_38 == 0) || (iVar2 != 0)) {
        Usage();
      }
      if ((local_38 == 1) || (local_38 == 4)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,opt.szSource,&local_351);
        local_368 = opt.range;
        local_21 = ScanImage(&local_350,opt.range);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator(&local_351);
      }
      else {
        Usage();
      }
      break;
    case 2:
      if ((local_38 == 0) || (iVar2 != 0)) {
        Usage();
      }
      if (local_38 == 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,opt.szSource,&local_439);
        FormatHdd(&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        std::allocator<char>::~allocator(&local_439);
      }
      else if (local_38 == 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_460,opt.szSource,&local_461);
        FormatBoot(&local_460);
        std::__cxx11::string::~string((string *)&local_460);
        std::allocator<char>::~allocator(&local_461);
      }
      else if (local_38 == 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_488,opt.szSource,&local_489);
        local_4a8 = opt.range;
        FormatImage(&local_488,opt.range);
        std::__cxx11::string::~string((string *)&local_488);
        std::allocator<char>::~allocator(&local_489);
      }
      else {
        Usage();
      }
      break;
    case 3:
      if (iVar2 != 0) {
        Usage();
      }
      if (local_38 == 0) {
        local_21 = ListDrives(opt.verbose);
      }
      else if ((local_38 == 2) || (local_38 == 1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,opt.szSource,&local_2b1);
        local_21 = ListRecords(&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
      }
      else if (local_38 == 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,opt.szSource,&local_2d9);
        local_21 = DirImage(&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::allocator<char>::~allocator(&local_2d9);
      }
      else {
        Usage();
      }
      break;
    case 4:
      if ((local_38 == 0) || (iVar2 != 0)) {
        Usage();
      }
      if ((local_38 == 2) || (local_38 == 1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5c8,opt.szSource,&local_5c9);
        local_5e8 = opt.range;
        local_21 = ViewHdd(&local_5c8,opt.range);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::allocator<char>::~allocator(&local_5c9);
      }
      else if (local_38 == 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_608,opt.szSource,&local_609);
        local_628 = opt.range;
        local_21 = ViewBoot(&local_608,opt.range);
        std::__cxx11::string::~string((string *)&local_608);
        std::allocator<char>::~allocator(&local_609);
      }
      else if (local_38 == 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_648,opt.szSource,&local_649);
        local_668 = opt.range;
        local_21 = ViewImage(&local_648,opt.range);
        std::__cxx11::string::~string((string *)&local_648);
        std::allocator<char>::~allocator(&local_649);
      }
      else {
        Usage();
      }
      break;
    case 5:
      if ((local_38 == 0) || (iVar2 != 0)) {
        Usage();
      }
      if ((local_38 == 2) || (local_38 == 1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_578,opt.szSource,&local_579);
        local_21 = HddInfo(&local_578,opt.verbose);
        std::__cxx11::string::~string((string *)&local_578);
        std::allocator<char>::~allocator(&local_579);
      }
      else if (local_38 == 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5a0,opt.szSource,&local_5a1);
        local_21 = ImageInfo(&local_5a0);
        std::__cxx11::string::~string((string *)&local_5a0);
        std::allocator<char>::~allocator(&local_5a1);
      }
      else {
        Usage();
      }
      break;
    case 6:
      if ((local_38 == 0) || (iVar2 != 0)) {
        Usage();
      }
      if (local_38 == 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_300,opt.szSource,&local_301);
        local_21 = ListRecords(&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::allocator<char>::~allocator(&local_301);
      }
      else if (local_38 == 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_328,opt.szSource,&local_329);
        local_21 = DirImage(&local_328);
        std::__cxx11::string::~string((string *)&local_328);
        std::allocator<char>::~allocator(&local_329);
      }
      else {
        Usage();
      }
      break;
    case 7:
      if ((local_38 == 0) || (iVar2 != 0)) {
        Usage();
      }
      if (local_38 == 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_688,opt.szSource,(allocator<char> *)((long)&e_4 + 7));
        local_21 = DiskRpm(&local_688);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator((allocator<char> *)((long)&e_4 + 7));
      }
      else {
        Usage();
      }
      break;
    case 8:
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"verify command not yet implemented");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    case 9:
      if ((local_38 == 0) || (iVar2 != 0)) {
        Usage();
      }
      opt.nosig = 1;
      if (local_38 == 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,opt.szSource,&local_389);
        local_21 = FormatHdd(&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator(&local_389);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b0,opt.szSource,&local_3b1);
        bVar1 = IsRecord(&local_3b0,(int *)0x0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::allocator<char>::~allocator(&local_3b1);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,opt.szSource,&local_3d9);
          local_21 = FormatRecord(&local_3d8);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::allocator<char>::~allocator(&local_3d9);
        }
        else if (local_38 == 4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,opt.szSource,&local_401);
          local_418 = opt.range;
          local_21 = UnformatImage(&local_400,opt.range);
          std::__cxx11::string::~string((string *)&local_400);
          std::allocator<char>::~allocator(&local_401);
        }
        else {
          Usage();
        }
      }
      break;
    case 10:
      if ((local_38 != 0) || (iVar2 != 0)) {
        Usage();
      }
      LongVersion();
      local_21 = 1;
      break;
    case 0xb:
      if (local_38 == 0) {
        Usage();
      }
      local_4ca = 0;
      local_4cb = 0;
      local_8ba = false;
      if (local_38 == 2) {
        std::allocator<char>::allocator();
        local_4ca = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4c8,opt.szSource,&local_4c9);
        local_4cb = 1;
        bVar1 = IsHddImage(&local_4c8);
        local_8ba = false;
        if (bVar1) {
          local_8ba = local_60 != 0 || opt.sectors != -1;
        }
      }
      if ((local_4cb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      if ((local_4ca & 1) != 0) {
        std::allocator<char>::~allocator(&local_4c9);
      }
      if (local_8ba) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4f0,opt.szSource,&local_4f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_518,opt.szTarget,&local_519);
        iVar2 = util::str_value<int>(&local_518);
        local_21 = CreateHddImage(&local_4f0,iVar2);
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator(&local_519);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator(&local_4f1);
      }
      else if ((local_38 == 4) && (local_60 == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_540,opt.szSource,&local_541);
        local_558 = opt.range;
        local_21 = CreateImage(&local_540,opt.range);
        std::__cxx11::string::~string((string *)&local_540);
        std::allocator<char>::~allocator(&local_541);
      }
      else {
        Usage();
      }
      break;
    default:
      Usage();
    }
    if (opt.time != 0) {
      elapsed_ms = std::chrono::_V2::system_clock::now();
      local_720.__r =
           (rep)std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&elapsed_ms,&stack0xffffffffffffffe0);
      local_718.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&local_720);
      local_710 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_718);
      pLVar3 = util::operator<<((LogHelper *)&util::cout,(char (*) [15])"Elapsed time: ");
      pLVar3 = util::operator<<(pLVar3,&local_710);
      util::operator<<(pLVar3,(char (*) [4])"ms\n");
    }
    pLVar3 = util::operator<<((LogHelper *)&util::cout,none);
    util::operator<<(pLVar3,(char (*) [1])0x2abc92);
    std::ofstream::close();
    argv__local._4_4_ = (uint)((local_21 & 1) == 0);
  }
  else {
    argv__local._4_4_ = 1;
  }
  return argv__local._4_4_;
}

Assistant:

int main(int argc_, char* argv_[])
{
    auto start_time = std::chrono::system_clock::now();

#ifdef _WIN32
#ifdef _DEBUG
    _CrtSetDbgFlag(_CrtSetDbgFlag(_CRTDBG_REPORT_FLAG) | _CRTDBG_LEAK_CHECK_DF);
#endif

    SetUnhandledExceptionFilter(CrashDumpUnhandledExceptionFilter);

#ifndef _DEBUG
    // Check if we've been run from GUI mode with no arguments
    if (!IsConsoleWindow() && util::is_stdout_a_tty() && argc_ == 1)
    {
        FreeConsole();

        char szPath[MAX_PATH];
        GetModuleFileName(GetModuleHandle(NULL), szPath, ARRAYSIZE(szPath));

        auto strCommand = std::string("/k \"") + szPath + "\" --help";
        GetEnvironmentVariable("COMSPEC", szPath, ARRAYSIZE(szPath));

        auto ret = static_cast<int>(reinterpret_cast<ULONG_PTR>(
            ShellExecute(NULL, "open", szPath, strCommand.c_str(), NULL, SW_NORMAL)));

        // Fall back on the old message if it failed
        if (ret < 32)
            MessageBox(nullptr, "I'm a console-mode utility, please run me from a Command Prompt!", "SAMdisk", MB_OK | MB_ICONSTOP);

        return 0;
    }
#endif // _DEBUG
#endif // _WIN32

    bool f = false;

    try
    {
        if (!ParseCommandLine(argc_, argv_))
            return 1;

        // Read at most two non-option command-line arguments
        if (optind < argc_) strncpy(opt.szSource, argv_[optind++], arraysize(opt.szSource) - 1);
        if (optind < argc_) strncpy(opt.szTarget, argv_[optind++], arraysize(opt.szTarget) - 1);
        if (optind < argc_) Usage();

        int nSource = GetArgType(opt.szSource);
        int nTarget = GetArgType(opt.szTarget);

        switch (opt.command)
        {
        case cmdCopy:
        {
            if (nSource == argNone || nTarget == argNone)
                Usage();

            if (nSource == argDisk && IsTrinity(opt.szTarget))
                f = Image2Trinity(opt.szSource, opt.szTarget);          // file/image -> Trinity
            else if ((nSource == argBlock || nSource == argDisk) && (nTarget == argDisk || nTarget == argHDD /*for .raw*/))
                f = ImageToImage(opt.szSource, opt.szTarget);           // image -> image
            else if ((nSource == argHDD || nSource == argBlock) && nTarget == argHDD)
                f = Hdd2Hdd(opt.szSource, opt.szTarget);                // hdd -> hdd
            else if (nSource == argBootSector && nTarget == argDisk)
                f = Hdd2Boot(opt.szSource, opt.szTarget);               // boot -> file
            else if (nSource == argDisk && nTarget == argBootSector)
                f = Boot2Hdd(opt.szSource, opt.szTarget);               // file -> boot
            else if (nSource == argBootSector && nTarget == argBootSector)
                f = Boot2Boot(opt.szSource, opt.szTarget);              // boot -> boot
            else
                Usage();

            break;
        }

        case cmdList:
        {
            if (nTarget != argNone)
                Usage();

            if (nSource == argNone)
                f = ListDrives(opt.verbose);
            else if (nSource == argHDD || nSource == argBlock)
                f = ListRecords(opt.szSource);
            else if (nSource == argDisk)
                f = DirImage(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdDir:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();
#if 0
            if (nSource == argFloppy)
                f = DirFloppy(opt.szSource);
            else
#endif
                if (nSource == argHDD)
                    f = ListRecords(opt.szSource);
                else if (nSource == argDisk)
                    f = DirImage(opt.szSource);
                else
                    Usage();

            break;
        }

        case cmdScan:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argBlock || nSource == argDisk)
                f = ScanImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdUnformat:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            // Don't write disk signatures during any formatting
            opt.nosig = true;

            if (nSource == argHDD)
                f = FormatHdd(opt.szSource);
            else if (IsRecord(opt.szSource))
                f = FormatRecord(opt.szSource);
            else if (nSource == argDisk)
                f = UnformatImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdFormat:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD)
                FormatHdd(opt.szSource);
            else if (nSource == argBootSector)
                FormatBoot(opt.szSource);
            else if (nSource == argDisk)
                FormatImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdVerify:
            throw std::logic_error("verify command not yet implemented");

        case cmdCreate:
        {
            if (nSource == argNone)
                Usage();

            if (nSource == argHDD && IsHddImage(opt.szSource) && (nTarget != argNone || opt.sectors != -1))
                f = CreateHddImage(opt.szSource, util::str_value<int>(opt.szTarget));
            else if (nSource == argDisk && nTarget == argNone)
                f = CreateImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdInfo:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD || nSource == argBlock)
                f = HddInfo(opt.szSource, opt.verbose);
            else if (nSource == argDisk)
                f = ImageInfo(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdView:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD || nSource == argBlock)
                f = ViewHdd(opt.szSource, opt.range);
            else if (nSource == argBootSector)
                f = ViewBoot(opt.szSource, opt.range);
            else if (nSource == argDisk)
                f = ViewImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdRpm:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argDisk)
                f = DiskRpm(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdVersion:
        {
            if (nSource != argNone || nTarget != argNone)
                Usage();

            LongVersion();
            f = true;
            break;
        }

        default:
            Usage();
            break;
        }
    }
    catch (std::string & e)
    {
        util::cout << "Error: " << colour::RED << e << colour::none << '\n';
    }
    catch (util::exception & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
    catch (std::system_error & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
    catch (std::logic_error & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
#ifndef _WIN32
    catch (std::exception & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
#endif

    if (opt.time)
    {
        auto end_time = std::chrono::system_clock::now();
        auto elapsed_ms = std::chrono::duration_cast<std::chrono::milliseconds>(end_time - start_time).count();
        util::cout << "Elapsed time: " << elapsed_ms << "ms\n";
    }

    util::cout << colour::none << "";
    util::log.close();

    return f ? 0 : 1;
}